

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

void normalize(lzma_mf *mf)

{
  uint uVar1;
  uint32_t *puVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t uVar5;
  
  if (mf->offset + mf->read_pos == -1) {
    uVar3 = ~mf->cyclic_size;
    if (mf->hash_count != 0) {
      puVar2 = mf->hash;
      uVar4 = 0;
      do {
        uVar1 = puVar2[uVar4];
        uVar5 = uVar1 - uVar3;
        if (uVar1 < uVar3) {
          uVar5 = 0;
        }
        puVar2[uVar4] = uVar5;
        uVar4 = uVar4 + 1;
      } while (uVar4 < mf->hash_count);
    }
    if (mf->sons_count != 0) {
      puVar2 = mf->son;
      uVar4 = 0;
      do {
        uVar1 = puVar2[uVar4];
        uVar5 = uVar1 - uVar3;
        if (uVar1 < uVar3) {
          uVar5 = 0;
        }
        puVar2[uVar4] = uVar5;
        uVar4 = uVar4 + 1;
      } while (uVar4 < mf->sons_count);
    }
    mf->offset = mf->offset - uVar3;
    return;
  }
  __assert_fail("mf->read_pos + mf->offset == MUST_NORMALIZE_POS",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                ,0x6e,"void normalize(lzma_mf *)");
}

Assistant:

static void
normalize(lzma_mf *mf)
{
	assert(mf->read_pos + mf->offset == MUST_NORMALIZE_POS);

	// In future we may not want to touch the lowest bits, because there
	// may be match finders that use larger resolution than one byte.
	const uint32_t subvalue
			= (MUST_NORMALIZE_POS - mf->cyclic_size);
				// & (~(UINT32_C(1) << 10) - 1);

	for (uint32_t i = 0; i < mf->hash_count; ++i) {
		// If the distance is greater than the dictionary size,
		// we can simply mark the hash element as empty.
		if (mf->hash[i] <= subvalue)
			mf->hash[i] = EMPTY_HASH_VALUE;
		else
			mf->hash[i] -= subvalue;
	}

	for (uint32_t i = 0; i < mf->sons_count; ++i) {
		// Do the same for mf->son.
		//
		// NOTE: There may be uninitialized elements in mf->son.
		// Valgrind may complain that the "if" below depends on
		// an uninitialized value. In this case it is safe to ignore
		// the warning. See also the comments in lz_encoder_init()
		// in lz_encoder.c.
		if (mf->son[i] <= subvalue)
			mf->son[i] = EMPTY_HASH_VALUE;
		else
			mf->son[i] -= subvalue;
	}

	// Update offset to match the new locations.
	mf->offset -= subvalue;

	return;
}